

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsDataCollectionCreate(FmsMesh mesh,char *dc_name,FmsDataCollection *dc)

{
  FmsDataCollection __ptr;
  char *pcVar1;
  int iVar2;
  
  if (mesh == (FmsMesh)0x0) {
    iVar2 = 1;
  }
  else if (dc == (FmsDataCollection *)0x0) {
    iVar2 = 2;
  }
  else {
    __ptr = (FmsDataCollection)calloc(1,0x38);
    iVar2 = 3;
    if (__ptr != (FmsDataCollection)0x0) {
      iVar2 = 0;
      if (dc_name == (char *)0x0) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = strdup(dc_name);
        if (pcVar1 == (char *)0x0) {
          free(__ptr);
          return 3;
        }
      }
      __ptr->name = pcVar1;
      __ptr->mesh = mesh;
      *dc = __ptr;
    }
  }
  return iVar2;
}

Assistant:

int FmsDataCollectionCreate(FmsMesh mesh, const char *dc_name,
                            FmsDataCollection *dc) {
  if (!mesh) { E_RETURN(1); }
  if (!dc) { E_RETURN(2); }
  FmsDataCollection dcoll;
  dcoll = calloc(1, sizeof(*dcoll));
  if (dcoll == NULL) { E_RETURN(3); }
  // On error, call free(dcoll)
  // Init dcoll
  if (FmsCopyString(dc_name, &dcoll->name)) { free(dcoll); E_RETURN(3); }
  dcoll->mesh = mesh;
  *dc = dcoll;
  return 0;
}